

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  bool bVar1;
  slot_type *slot;
  ctrl_t *pcVar2;
  size_t i;
  size_t sVar3;
  undefined1 local_7a;
  undefined1 local_79;
  slot_type *new_slots;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
  *set;
  HashSetResizeHelper resize_helper;
  anon_class_24_3_14f42436 insert_slot;
  
  set = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
         *)common;
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    resize_helper.old_capacity_ = common->capacity_;
    resize_helper.had_infoz_ = (bool)((byte)common->size_ & 1);
    resize_helper.was_soo_ = false;
    resize_helper.had_soo_slot_ = false;
    resize_helper.old_heap_or_soo_.heap.control = (common->heap_or_soo_).heap.control;
    resize_helper.old_heap_or_soo_.heap.slot_array = (common->heap_or_soo_).heap.slot_array;
    CommonFields::set_capacity(common,new_capacity);
    bVar1 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,24ul,false,false,8ul>
                      (&resize_helper,common,&local_79,0xffffffffffffff80,0x10,0x18);
    if (resize_helper.old_capacity_ != 0) {
      new_slots = *(slot_type **)((long)&common->heap_or_soo_ + 8);
      if (bVar1) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,std::pair<int,int>>,void>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>const,std::pair<int,int>>>>
                  (&resize_helper,common,
                   (allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>
                    *)common);
      }
      else {
        insert_slot.set = &set;
        insert_slot.new_slots = &new_slots;
        insert_slot.common = common;
        slot = (slot_type *)HashSetResizeHelper::old_slots(&resize_helper);
        for (sVar3 = 0; sVar3 != resize_helper.old_capacity_; sVar3 = sVar3 + 1) {
          pcVar2 = HashSetResizeHelper::old_ctrl(&resize_helper);
          if (kSentinel < pcVar2[sVar3]) {
            resize_impl::anon_class_24_3_14f42436::operator()(&insert_slot,slot);
          }
          slot = slot + 1;
        }
        CommonFields::infoz(common);
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>(&resize_helper,&local_7a,0x18);
    }
    return;
  }
  __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe92,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, std::equal_to<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, std::allocator<std::pair<const std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, Alloc = std::allocator<std::pair<const std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>>]"
               );
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE static void resize_impl(
      CommonFields& common, size_t new_capacity,
      HashtablezInfoHandle forced_infoz) {
    raw_hash_set* set = reinterpret_cast<raw_hash_set*>(&common);
    ABSL_SWISSTABLE_ASSERT(IsValidCapacity(new_capacity));
    ABSL_SWISSTABLE_ASSERT(!set->fits_in_soo(new_capacity));
    const bool was_soo = set->is_soo();
    const bool had_soo_slot = was_soo && !set->empty();
    const ctrl_t soo_slot_h2 =
        had_soo_slot ? static_cast<ctrl_t>(H2(set->hash_of(set->soo_slot())))
                     : ctrl_t::kEmpty;
    HashSetResizeHelper resize_helper(common, was_soo, had_soo_slot,
                                      forced_infoz);
    // Initialize HashSetResizeHelper::old_heap_or_soo_. We can't do this in
    // HashSetResizeHelper constructor because it can't transfer slots when
    // transfer_uses_memcpy is false.
    // TODO(b/289225379): try to handle more of the SOO cases inside
    // InitializeSlots. See comment on cl/555990034 snapshot #63.
    if (PolicyTraits::transfer_uses_memcpy() || !had_soo_slot) {
      resize_helper.old_heap_or_soo() = common.heap_or_soo();
    } else {
      set->transfer(set->to_slot(resize_helper.old_soo_data()),
                    set->soo_slot());
    }
    common.set_capacity(new_capacity);
    // Note that `InitializeSlots` does different number initialization steps
    // depending on the values of `transfer_uses_memcpy` and capacities.
    // Refer to the comment in `InitializeSlots` for more details.
    const bool grow_single_group =
        resize_helper.InitializeSlots<CharAlloc, sizeof(slot_type),
                                      PolicyTraits::transfer_uses_memcpy(),
                                      SooEnabled(), alignof(slot_type)>(
            common, CharAlloc(set->alloc_ref()), soo_slot_h2, sizeof(key_type),
            sizeof(value_type));

    // In the SooEnabled() case, capacity is never 0 so we don't check.
    if (!SooEnabled() && resize_helper.old_capacity() == 0) {
      // InitializeSlots did all the work including infoz().RecordRehash().
      return;
    }
    ABSL_SWISSTABLE_ASSERT(resize_helper.old_capacity() > 0);
    // Nothing more to do in this case.
    if (was_soo && !had_soo_slot) return;

    slot_type* new_slots = set->slot_array();
    if (grow_single_group) {
      if (PolicyTraits::transfer_uses_memcpy()) {
        // InitializeSlots did all the work.
        return;
      }
      if (was_soo) {
        set->transfer(new_slots + resize_helper.SooSlotIndex(),
                      to_slot(resize_helper.old_soo_data()));
        return;
      } else {
        // We want GrowSizeIntoSingleGroup to be called here in order to make
        // InitializeSlots not depend on PolicyTraits.
        resize_helper.GrowSizeIntoSingleGroup<PolicyTraits>(common,
                                                            set->alloc_ref());
      }
    } else {
      // InitializeSlots prepares control bytes to correspond to empty table.
      const auto insert_slot = [&](slot_type* slot) {
        size_t hash = PolicyTraits::apply(HashElement{set->hash_ref()},
                                          PolicyTraits::element(slot));
        auto target = find_first_non_full(common, hash);
        SetCtrl(common, target.offset, H2(hash), sizeof(slot_type));
        set->transfer(new_slots + target.offset, slot);
        return target.probe_length;
      };
      if (was_soo) {
        insert_slot(to_slot(resize_helper.old_soo_data()));
        return;
      } else {
        auto* old_slots = static_cast<slot_type*>(resize_helper.old_slots());
        size_t total_probe_length = 0;
        for (size_t i = 0; i != resize_helper.old_capacity(); ++i) {
          if (IsFull(resize_helper.old_ctrl()[i])) {
            total_probe_length += insert_slot(old_slots + i);
          }
        }
        common.infoz().RecordRehash(total_probe_length);
      }
    }
    resize_helper.DeallocateOld<alignof(slot_type)>(CharAlloc(set->alloc_ref()),
                                                    sizeof(slot_type));
  }